

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

PassToken __thiscall spvtools::CreateModifyMaximalReconvergencePass(spvtools *this,bool add)

{
  unique_ptr<spvtools::opt::ModifyMaximalReconvergence,_std::default_delete<spvtools::opt::ModifyMaximalReconvergence>_>
  local_28;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_20;
  bool local_11;
  spvtools *psStack_10;
  bool add_local;
  
  local_11 = add;
  psStack_10 = this;
  MakeUnique<spvtools::opt::ModifyMaximalReconvergence,bool&>((spvtools *)&local_28,&local_11);
  MakeUnique<spvtools::Optimizer::PassToken::Impl,std::unique_ptr<spvtools::opt::ModifyMaximalReconvergence,std::default_delete<spvtools::opt::ModifyMaximalReconvergence>>>
            ((spvtools *)&local_20,&local_28);
  Optimizer::PassToken::PassToken((PassToken *)this,&local_20);
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<spvtools::opt::ModifyMaximalReconvergence,_std::default_delete<spvtools::opt::ModifyMaximalReconvergence>_>
  ::~unique_ptr(&local_28);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateModifyMaximalReconvergencePass(bool add) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::ModifyMaximalReconvergence>(add));
}